

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O0

bool vkt::shaderexecutor::
     ContainerTraits<tcu::Matrix<float,_4,_4>,_tcu::Matrix<tcu::Interval,_4,_4>_>::doContains
               (IVal *ival,Matrix<float,_4,_4> *value)

{
  bool bVar1;
  Vector<tcu::Interval,_4> *ival_00;
  Vector<float,_4> *value_00;
  int local_24;
  int ndx;
  Matrix<float,_4,_4> *value_local;
  IVal *ival_local;
  
  local_24 = 0;
  while( true ) {
    if (3 < local_24) {
      return true;
    }
    ival_00 = tcu::Matrix<tcu::Interval,_4,_4>::operator[](ival,local_24);
    value_00 = tcu::Matrix<float,_4,_4>::operator[](value,local_24);
    bVar1 = contains<tcu::Vector<float,4>>(ival_00,value_00);
    if (!bVar1) break;
    local_24 = local_24 + 1;
  }
  return false;
}

Assistant:

static bool			doContains		(const IVal& ival, const T& value)
	{
		for (int ndx = 0; ndx < T::SIZE; ++ndx)
			if (!contains(ival[ndx], value[ndx]))
				return false;

		return true;
	}